

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NameReader::Read<internal::NameHandler>
          (NameReader *this,CStringRef filename,NameHandler *handler)

{
  CStringRef filename_00;
  char *s;
  size_t size;
  NameHandler *in_RSI;
  MemoryMappedFileBase *in_RDI;
  StringRef in_stack_00000000;
  CStringRef in_stack_00000010;
  StringRef data;
  File file;
  File *in_stack_ffffffffffffffa0;
  MemoryMappedFile<fmt::File> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  File *in_stack_ffffffffffffffb8;
  CStringRef in_stack_ffffffffffffffc0;
  
  fmt::File::File(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb4);
  filename_00.data_._4_4_ = in_stack_ffffffffffffffb4;
  filename_00.data_._0_4_ = in_stack_ffffffffffffffb0;
  MemoryMappedFile<fmt::File>::map(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,filename_00);
  fmt::File::~File(in_stack_ffffffffffffffa0);
  s = MemoryMappedFileBase::start(in_RDI);
  size = MemoryMappedFileBase::size(in_RDI);
  fmt::BasicStringRef<char>::BasicStringRef((BasicStringRef<char> *)&stack0xffffffffffffffb0,s,size)
  ;
  ReadNames<internal::NameHandler>(in_stack_00000010,in_stack_00000000,in_RSI);
  return;
}

Assistant:

void Read(fmt::CStringRef filename, NameHandler &handler) {
    try {
      fmt::File file(filename, fmt::File::RDONLY);
      mapped_file_.map(file, filename);
    } catch (...) {
      return;           // ignore if not provided
    }
    fmt::StringRef data(mapped_file_.start(), mapped_file_.size());
    ReadNames(filename, data, handler);
  }